

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O3

string * __thiscall
ninx::parser::element::Block::__render_output_abi_cxx11_(string *__return_storage_ptr__,Block *this)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *segment;
  pointer __pos;
  stringstream output;
  size_type *local_1d0;
  size_type local_1c8;
  size_type local_1c0;
  undefined8 uStack_1b8;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  __pos = (this->__output_segments).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->__output_segments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__pos != pbVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,(__pos->_M_dataplus)._M_p,__pos->_M_string_length);
      __pos = __pos + 1;
    } while (__pos != pbVar1);
    __pos = (this->__output_segments).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->__output_segments,__pos);
  std::__cxx11::stringbuf::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_1d0 == &local_1c0) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1c0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_1b8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_1d0;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_1c0;
  }
  __return_storage_ptr__->_M_string_length = local_1c8;
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string ninx::parser::element::Block::__render_output() {
    std::stringstream output;
    for (auto &segment : __output_segments) {
        output << segment;
    }
    __output_segments.clear();
    return std::move(output.str());
}